

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const*&,unsigned_long_const&,char_const(&)[2],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[9],wabt::(anonymous_namespace)::StackVar,char_const(&)[2]>
          (CWriter *this,char **t,unsigned_long *u,char (*args) [2],ExternalInstancePtr *args_1,
          char (*args_2) [9],StackVar *args_3,char (*args_4) [2])

{
  char *__s;
  size_t size;
  
  __s = *t;
  size = strlen(__s);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,__s,size);
  anon_unknown_0::CWriter::Writef((CWriter *)this,"%u",(ulong)(uint)*u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"(",1);
  anon_unknown_0::CWriter::Write((CWriter *)this,(ExternalInstancePtr *)args);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,", (u64)(",8);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)args_1);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,")",1);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }